

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

StatisticObject __thiscall
Clasp::ClaspStatistics::findObject(ClaspStatistics *this,Key_t root,char *path,Key_t *res)

{
  StatisticObject *pSVar1;
  StatisticObject *__src;
  bool bVar2;
  uint uVar3;
  StatisticObject *pSVar4;
  ulong __n;
  Key_t KVar5;
  Key_t *in_RCX;
  StatisticObject *in_RDX;
  StatisticObject *in_RDI;
  size_t len;
  int pos;
  char *parent;
  char *top;
  char temp [1024];
  Type t;
  StatisticObject o;
  ClaspStatistics *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  uint32 in_stack_fffffffffffffb74;
  StatisticObject *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 uVar6;
  StatisticObject in_stack_fffffffffffffb98;
  StatisticObject in_stack_fffffffffffffba0;
  int local_44c;
  StatisticObject *local_440;
  StatisticObject local_438 [129];
  Statistics_t local_2c;
  Key_t *local_28;
  StatisticObject *local_20;
  uint64 local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_8 = (uint64)getObject(in_stack_fffffffffffffb68,0x207311);
  local_2c.val_ = (E)StatisticObject::type((StatisticObject *)in_stack_fffffffffffffb68);
  pSVar1 = local_20;
  while( true ) {
    __src = local_20;
    uVar6 = false;
    if (local_20 != (StatisticObject *)0x0) {
      uVar6 = (char)local_20->handle_ != '\0';
    }
    if ((bool)uVar6 == false) break;
    local_440 = local_20;
    pSVar4 = (StatisticObject *)strchr((char *)local_20,0x2e);
    local_20 = pSVar4;
    if (pSVar4 != (StatisticObject *)0x0) {
      local_20 = (StatisticObject *)((long)&pSVar4->handle_ + 1);
      __n = (long)pSVar4 - (long)__src;
      if (0x3ff < __n) {
        Potassco::fail(-1,
                       "StatisticObject Clasp::ClaspStatistics::findObject(Key_t, const char *, Key_t *) const"
                       ,0x15c,"len < 1024","invalid key",0);
      }
      in_stack_fffffffffffffb78 = local_438;
      memcpy(in_stack_fffffffffffffb78,__src,__n);
      *(undefined1 *)((long)local_438 + __n) = 0;
      local_440 = in_stack_fffffffffffffb78;
    }
    uVar3 = Potassco::Statistics_t::operator_cast_to_unsigned_int(&local_2c);
    if (uVar3 == 3) {
      in_stack_fffffffffffffba0 =
           StatisticObject::at(in_RDI,(char *)CONCAT17(uVar6,in_stack_fffffffffffffb80));
      local_8 = in_stack_fffffffffffffba0.handle_;
    }
    else {
      uVar3 = Potassco::Statistics_t::operator_cast_to_unsigned_int(&local_2c);
      if (((uVar3 != 2) ||
          (bVar2 = Potassco::match((char **)in_stack_fffffffffffffb78,
                                   (int *)CONCAT44(in_stack_fffffffffffffb74,
                                                   in_stack_fffffffffffffb70)), !bVar2)) ||
         (local_44c < 0)) {
        Potassco::fail(0x22,
                       "StatisticObject Clasp::ClaspStatistics::findObject(Key_t, const char *, Key_t *) const"
                       ,0x165,"false","invalid path: \'%s\' at key \'%s\'",pSVar1,local_440,0);
      }
      in_stack_fffffffffffffb98 =
           StatisticObject::operator[](in_stack_fffffffffffffb78,in_stack_fffffffffffffb74);
      local_8 = in_stack_fffffffffffffb98.handle_;
    }
    local_2c.val_ = (E)StatisticObject::type((StatisticObject *)in_stack_fffffffffffffb68);
  }
  if (local_28 != (Key_t *)0x0) {
    KVar5 = Impl::add((Impl *)in_stack_fffffffffffffba0.handle_,
                      (StatisticObject *)in_stack_fffffffffffffb98.handle_);
    *local_28 = KVar5;
  }
  return (StatisticObject)local_8;
}

Assistant:

StatisticObject ClaspStatistics::findObject(Key_t root, const char* path, Key_t* res) const {
	StatisticObject o = getObject(root);
	StatisticObject::Type t = o.type();
	char temp[1024]; const char* top, *parent = path;
	for (int pos; path && *path;) {
		top = path;
		if ((path = std::strchr(path, '.')) != 0) {
			std::size_t len = static_cast<std::size_t>(path++ - top);
			POTASSCO_ASSERT(len < 1024, "invalid key");
			top = (const char*)std::memcpy(temp, top, len);
			temp[len] = 0;
		}
		if      (t == Potassco::Statistics_t::Map) { o = o.at(top); }
		else if (t == Potassco::Statistics_t::Array && Potassco::match(top, pos) && pos >= 0) {
			o = o[uint32(pos)];
		}
		else {
			POTASSCO_CHECK(false, ERANGE, "invalid path: '%s' at key '%s'", parent, top);
		}
		t = o.type();
	}
	if (res) { *res = impl_->add(o); }
	return o;
}